

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,_1,1,1,_1>const>const,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>const,_1,1,true>const,_1,1,false>const>const>,Eigen::TriangularView<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>const,_1,_1,false>const,5u>,0>,Eigen::internal::assign_op<float,float>>
               (Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>
                *dst,Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_5U>,_0>
                     *src,assign_op<float,_float> *func)

{
  ActualDstType actualDst;
  assign_op<float,_float> *func_local;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_5U>,_0>
  *src_local;
  Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false> *dst_local
  ;
  
  Assignment<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>,_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false>,_-1,_-1,_false>,_5U>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}